

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O1

Program __thiscall MemoryManagement::run(MemoryManagement *this,Program *program)

{
  mapped_type pFVar1;
  Function *this_00;
  mapped_type *ppFVar2;
  Function *extraout_RDX;
  Function *pFVar3;
  Expression *expression;
  Expression *pEVar4;
  Program PVar5;
  Function *function_1;
  Function *function;
  FunctionTable function_table;
  Function *local_120;
  Function *local_118;
  undefined1 local_110 [16];
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  size_t local_e8;
  Function *local_e0;
  undefined1 local_d8 [16];
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  size_t local_b8;
  Function *local_b0;
  _Rb_tree_color local_a8 [2];
  _Base_ptr local_a0;
  _Base_ptr local_98;
  _Base_ptr local_90;
  size_t local_88;
  undefined **local_80;
  UsageTable *local_78;
  Block *local_70;
  undefined8 local_68;
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  local_60;
  
  (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)0x0;
  this->function_table = (FunctionTable *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar3 = program->first;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pFVar3 != (Function *)0x0) {
    do {
      local_110._0_8_ = pFVar3;
      this_00 = (Function *)operator_new(0x60);
      Function::Function(this_00,&pFVar3->argument_types,pFVar3->return_type);
      if ((this->super_Visitor<const_Expression_*>)._vptr_Visitor == (_func_int **)0x0) {
        (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)this_00;
      }
      if (this->function_table != (FunctionTable *)0x0) {
        this->function_table[1]._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00;
      }
      this->function_table = (FunctionTable *)this_00;
      ppFVar2 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                              *)&local_60,(key_type *)local_110);
      *ppFVar2 = this_00;
      pFVar3 = pFVar3->next_function;
    } while (pFVar3 != (Function *)0x0);
  }
  pFVar3 = program->first;
  local_118 = (Function *)this;
  if (pFVar3 != (Function *)0x0) {
    do {
      local_120 = pFVar3;
      ppFVar2 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                              *)&local_60,&local_120);
      pFVar1 = *ppFVar2;
      local_110._8_4_ = _S_red;
      local_100 = (_Base_ptr)0x0;
      local_f8 = (_Base_ptr)(local_110 + 8);
      local_e8 = 0;
      local_d8._0_4_ = _S_red;
      local_d8._8_8_ = (_Base_ptr)0x0;
      local_c8 = (_Base_ptr)local_d8;
      local_b8 = 0;
      local_a8[0] = _S_red;
      local_a0 = (_Base_ptr)0x0;
      local_98 = (_Base_ptr)local_a8;
      local_88 = 0;
      local_f0 = local_f8;
      local_c0 = local_c8;
      local_90 = local_98;
      UsageAnalysis1::evaluate((UsageTable *)local_110,&local_120->block,1);
      local_70 = &local_120->block;
      local_80 = &PTR_visit_int_literal_00154a80;
      local_68 = 1;
      local_78 = (UsageTable *)local_110;
      for (pEVar4 = (local_120->block).first; pEVar4 != (Expression *)0x0;
          pEVar4 = pEVar4->next_expression) {
        (*pEVar4->_vptr_Expression[2])(pEVar4,&local_80);
      }
      evaluate((FunctionTable *)&local_60,(UsageTable *)local_110,&pFVar1->block,&local_120->block);
      std::
      _Rb_tree<const_Expression_*,_std::pair<const_Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<const_Expression_*const,_unsigned_long>_>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_unsigned_long>_>_>
      ::~_Rb_tree((_Rb_tree<const_Expression_*,_std::pair<const_Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<const_Expression_*const,_unsigned_long>_>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_unsigned_long>_>_>
                   *)&local_b0);
      std::
      _Rb_tree<const_Block_*,_std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>,_std::_Select1st<std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>_>,_std::less<const_Block_*>,_std::allocator<std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<const_Block_*,_std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>,_std::_Select1st<std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>_>,_std::less<const_Block_*>,_std::allocator<std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>_>_>
                   *)&local_e0);
      std::
      _Rb_tree<const_Block_*,_std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>_>,_std::less<const_Block_*>,_std::allocator<std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<const_Block_*,_std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>_>,_std::less<const_Block_*>,_std::allocator<std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>_>_>
                   *)local_110);
      pFVar3 = pFVar3->next_function;
    } while (pFVar3 != (Function *)0x0);
  }
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::~_Rb_tree(&local_60);
  PVar5.last = extraout_RDX;
  PVar5.first = local_118;
  return PVar5;
}

Assistant:

static Program run(const Program& program) {
		Program new_program;
		FunctionTable function_table;
		for (const Function* function: program) {
			Function* new_function = new Function(function->get_argument_types(), function->get_return_type());
			new_program.add_function(new_function);
			function_table[function] = new_function;
		}
		for (const Function* function: program) {
			Function* new_function = function_table[function];
			UsageTable usage_table;
			UsageAnalysis1::evaluate(usage_table, function->get_block());
			UsageAnalysis2::evaluate(usage_table, function->get_block());
			evaluate(function_table, usage_table, new_function->get_block(), function->get_block());
		}
		return new_program;
	}